

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O2

bool __thiscall
raptor::anon_unknown_5::DoSplitHostPort
          (anon_unknown_5 *this,StringView name,StringView *host,StringView *port,bool *has_port)

{
  size_t pos;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  StringView *this_00;
  ulong uVar4;
  ulong uVar5;
  StringView name_local;
  
  this_00 = (StringView *)name._size;
  name_local._size = (size_t)name._ptr;
  *(undefined1 *)&port->_ptr = 0;
  name_local._ptr = (char *)this;
  if (*this != (anon_unknown_5)0x5b) {
    sVar1 = StringView::find(&name_local,':',0);
    if (sVar1 != 0xffffffffffffffff) {
      pos = sVar1 + 1;
      sVar2 = StringView::find(&name_local,':',pos);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = sVar1;
        if (name_local._size < sVar1) {
          sVar2 = name_local._size;
        }
        this_00->_ptr = name_local._ptr;
        this_00->_size = sVar2;
        uVar3 = name_local._size - pos;
        if (~sVar1 + name_local._size <= name_local._size - pos) {
          uVar3 = ~sVar1 + name_local._size;
        }
        host->_ptr = name_local._ptr + pos;
        host->_size = uVar3;
        *(undefined1 *)&port->_ptr = 1;
        return true;
      }
    }
    this_00->_ptr = name_local._ptr;
    this_00->_size = name_local._size;
    host->_ptr = (char *)0x0;
    host->_size = 0;
    return true;
  }
  sVar1 = StringView::find(&name_local,']',1);
  if (sVar1 != 0xffffffffffffffff) {
    uVar3 = name_local._size - 1;
    if (sVar1 == uVar3) {
      host->_ptr = (char *)0x0;
      host->_size = 0;
    }
    else {
      if (name_local._ptr[sVar1 + 1] != ':') {
        return false;
      }
      uVar5 = (name_local._size - sVar1) - 2;
      uVar4 = name_local._size - (sVar1 + 2);
      if (uVar5 <= uVar4) {
        uVar4 = uVar5;
      }
      host->_ptr = name_local._ptr + sVar1 + 2;
      host->_size = uVar4;
      *(undefined1 *)&port->_ptr = 1;
    }
    uVar4 = sVar1 - 1;
    if (uVar3 < sVar1 - 1) {
      uVar4 = uVar3;
    }
    this_00->_ptr = name_local._ptr + 1;
    this_00->_size = uVar4;
    sVar1 = StringView::find(this_00,':',0);
    if (sVar1 != 0xffffffffffffffff) {
      return true;
    }
    this_00->_ptr = (char *)0x0;
    this_00->_size = 0;
  }
  return false;
}

Assistant:

bool DoSplitHostPort(StringView name, StringView* host, StringView* port,
                     bool* has_port) {
    *has_port = false;
    if (name[0] == '[') {
        /* Parse a bracketed host, typically an IPv6 literal. */
        const size_t rbracket = name.find(']', 1);
        if (rbracket == StringView::npos) {
            /* Unmatched [ */
            return false;
        }
        if (rbracket == name.size() - 1) {
            /* ]<end> */
            *port = StringView();
        } else if (name[rbracket + 1] == ':') {
            /* ]:<port?> */
            *port = name.substr(rbracket + 2, name.size() - rbracket - 2);
            *has_port = true;
        } else {
            /* ]<invalid> */
            return false;
        }
        *host = name.substr(1, rbracket - 1);
        if (host->find(':') == StringView::npos) {
            /* Require all bracketed hosts to contain a colon, because a hostname or
                IPv4 address should never use brackets. */
            *host = StringView();
            return false;
        }
    } else {
        size_t colon = name.find(':');
        if (colon != StringView::npos &&
            name.find(':', colon + 1) == StringView::npos) {
            /* Exactly 1 colon.  Split into host:port. */
            *host = name.substr(0, colon);
            *port = name.substr(colon + 1, name.size() - colon - 1);
            *has_port = true;
        } else {
            /* 0 or 2+ colons.  Bare hostname or IPv6 litearal. */
            *host = name;
            *port = StringView();
        }
    }
    return true;
}